

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O2

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t err_code_1;
  ZSTD_sequenceLength ZVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  size_t __n;
  U32 UVar12;
  size_t err_code;
  seqDef *psVar13;
  U32 UVar14;
  byte *pbVar15;
  ulong uVar16;
  BYTE *source;
  seqDef *psVar17;
  char *__assertion;
  undefined4 in_register_0000008c;
  uint uVar18;
  uint uVar19;
  long lVar20;
  byte *pbVar21;
  seqStore_t *seqStorePtr;
  U32 UVar22;
  size_t sVar23;
  void *pvVar24;
  bool bVar25;
  bool bVar26;
  undefined4 in_stack_fffffffffffffd78;
  byte *local_268;
  size_t local_260;
  undefined8 local_258;
  U32 local_250;
  seqDef *local_248;
  ulong local_240;
  ZSTD_compressedBlockState_t *local_238;
  long local_230;
  uint local_224;
  byte *local_220;
  byte *local_218;
  seqDef *local_210;
  BYTE *local_208;
  BYTE *local_200;
  BYTE *local_1f8;
  seqDef *local_1f0;
  ZSTD_compressedBlockState_t *local_1e8;
  void *local_1e0;
  byte *local_1d8;
  undefined8 local_1d0;
  seqDef *local_1c8;
  FSE_CTable *local_1c0;
  seqDef *local_1b8;
  seqDef *local_1b0;
  seqDef *local_1a8;
  ulong local_1a0;
  ZSTD_CCtx *local_198;
  seqDef *local_190;
  BYTE *local_188;
  seqStore_t *local_180;
  seqDef *local_178;
  byte *local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1d0 = CONCAT44(in_register_0000008c,lastBlock);
  seqStorePtr = &zc->seqStore;
  local_268 = (byte *)ZSTD_buildBlockEntropyStats
                                (seqStorePtr,&((zc->blockState).prevCBlock)->entropy,
                                 &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                                 &entropyMetadata,zc->entropyWorkspace,0x22d8);
  if (local_268 < (byte *)0xffffffffffffff89) {
    local_1e8 = (zc->blockState).prevCBlock;
    local_238 = (zc->blockState).nextCBlock;
    local_1a0 = (ulong)(uint)zc->bmi2;
    local_1f0 = (seqDef *)zc->entropyWorkspace;
    psVar17 = (zc->seqStore).sequencesStart;
    local_1a8 = (zc->seqStore).sequences;
    source = (zc->seqStore).litStart;
    local_188 = (zc->seqStore).lit;
    local_1d8 = (byte *)(srcSize + (long)src);
    local_230 = dstCapacity + (long)dst;
    local_1f8 = (zc->seqStore).llCode;
    local_200 = (zc->seqStore).mlCode;
    local_208 = (zc->seqStore).ofCode;
    local_170 = (byte *)(zc->appliedParams).targetCBlockSize;
    bVar25 = entropyMetadata.hufMetadata.hType == set_compressed;
    local_224 = (uint)(zc->bmi2 != 0);
    local_178 = local_1a8 + -1;
    local_1b8 = (seqDef *)&(local_238->entropy).fse;
    local_1c0 = (local_238->entropy).fse.litlengthCTable;
    local_1c8 = (seqDef *)(local_238->entropy).fse.matchlengthCTable;
    bVar2 = true;
    local_260 = 0;
    pbVar21 = (byte *)0x0;
    local_268 = (byte *)dst;
    local_248 = psVar17;
    local_218 = (byte *)src;
    local_1e0 = dst;
    local_1b0 = psVar17;
    local_198 = zc;
    local_180 = seqStorePtr;
    do {
      pbVar15 = pbVar21;
      if (local_1b0 == local_1a8) {
LAB_00591674:
        if (local_188 < source) {
          __assert_fail("lp <= lend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x1db,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
        pbVar21 = local_188 + -(long)source;
        dst = (void *)CONCAT71((int7)((ulong)dst >> 8),1);
        if (pbVar21 < pbVar15) {
          __assert_fail("litSize <= (size_t)(lend - lp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x1dc,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
      }
      else {
        dst = local_248 + local_260;
        ZVar4 = ZSTD_getSequenceLength(seqStorePtr,(seqDef *)dst);
        pbVar21 = pbVar21 + ((ulong)ZVar4 & 0xffffffff);
        local_260 = local_260 + 1;
        pbVar15 = pbVar21;
        if ((seqDef *)dst == local_178) goto LAB_00591674;
        dst = (seqDef *)0x0;
      }
      local_258 = CONCAT44(local_258._4_4_,0xff);
      pbVar15 = pbVar21;
      if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
        psVar17 = local_1f0;
        sVar23 = HIST_count_wksp(&local_1f0->offBase,(uint *)&local_258,source,(size_t)pbVar21,
                                 local_1f0,0x22d8);
        if (sVar23 < 0xffffffffffffff89) {
          sVar5 = HUF_estimateCompressedSize
                            ((HUF_CElt *)local_238,&local_1f0->offBase,(uint)local_258);
          sVar23 = entropyMetadata.hufMetadata.hufDesSize;
          if (!bVar25) {
            sVar23 = 0;
          }
          pbVar15 = (byte *)(sVar5 + sVar23 + 3);
        }
      }
      else if (entropyMetadata.hufMetadata.hType != set_basic) {
        if (entropyMetadata.hufMetadata.hType != set_rle) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x145,
                        "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                       );
        }
        pbVar15 = (byte *)0x1;
      }
      psVar13 = local_1f0;
      lVar8 = 3;
      uVar18 = (uint)dst;
      if (local_260 != 0) {
        sVar5 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.ofType,local_208,0x1f,local_260,
                           &local_1b8->offBase,(U8 *)0x0,OF_defaultNorm,5,0x1c,local_1f0,
                           CONCAT44(uVar18,in_stack_fffffffffffffd78));
        sVar6 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.llType,local_1f8,0x23,local_260,local_1c0,"",
                           LL_defaultNorm,6,0x23,psVar13,CONCAT44(uVar18,in_stack_fffffffffffffd78))
        ;
        psVar17 = local_1c8;
        sVar7 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.mlType,local_200,0x34,local_260,
                           &local_1c8->offBase,"",ML_defaultNorm,6,0x34,psVar13,
                           CONCAT44(uVar18,in_stack_fffffffffffffd78));
        sVar23 = 0;
        if (bVar2) {
          sVar23 = entropyMetadata.fseMetadata.fseTablesSize;
        }
        lVar8 = sVar23 + sVar5 + sVar6 + sVar7 + 3;
        dst = (void *)(ulong)uVar18;
        seqStorePtr = local_180;
      }
      if ((~(byte)dst & pbVar15 + lVar8 + 3 <= local_170) == 0) {
        local_190 = local_248 + local_260;
        pbVar15 = (byte *)0x0;
        lVar20 = 0;
        psVar13 = local_248;
        for (lVar8 = local_260 * 8; 0 < lVar8; lVar8 = lVar8 + -8) {
          ZVar4 = ZSTD_getSequenceLength(seqStorePtr,psVar13);
          pbVar15 = pbVar15 + ((ulong)ZVar4 & 0xffffffff);
          lVar20 = lVar20 + ((ulong)ZVar4 >> 0x20);
          psVar13 = psVar13 + 1;
        }
        if (pbVar21 < pbVar15) {
          __assert_fail("litLengthSum <= litSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x91,
                        "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                       );
        }
        if (pbVar15 != pbVar21 && (char)uVar18 == '\0') {
          __assert_fail("litLengthSum == litSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x93,
                        "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                       );
        }
        bVar26 = (int)local_1d0 != 0;
        pbVar15 = (byte *)CONCAT71((int7)((ulong)psVar17 >> 8),bVar26);
        local_220 = local_268 + 3;
        sVar23 = (local_230 - (long)local_268) - 3;
        lVar8 = 0;
        if (bVar25) {
          lVar8 = 200;
        }
        uVar16 = 3;
        if (bVar25) {
          uVar16 = (ulong)entropyMetadata.hufMetadata.hType;
        }
        lVar8 = (ulong)((byte *)(0x4000 - lVar8) <= pbVar21) -
                (ulong)(pbVar21 < (byte *)(0x400 - lVar8));
        if (pbVar21 == (byte *)0x0) goto LAB_00591a25;
        if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
          pbVar9 = local_268 + lVar8 + 7;
          local_240 = uVar16;
          if (entropyMetadata.hufMetadata.hType == set_compressed && bVar25) {
            memcpy(pbVar9,entropyMetadata.hufMetadata.hufDesBuffer,
                   entropyMetadata.hufMetadata.hufDesSize);
            pbVar9 = pbVar9 + entropyMetadata.hufMetadata.hufDesSize;
            local_210 = (seqDef *)entropyMetadata.hufMetadata.hufDesSize;
          }
          else {
            local_210 = (seqDef *)0x0;
          }
          uVar16 = lVar8 + 4;
          if (uVar16 == 3) {
            sVar5 = HUF_compress1X_usingCTable
                              (pbVar9,local_230 - (long)pbVar9,source,(size_t)pbVar21,
                               (HUF_CElt *)local_238,local_224);
          }
          else {
            sVar5 = HUF_compress4X_usingCTable
                              (pbVar9,local_230 - (long)pbVar9,source,(size_t)pbVar21,
                               (HUF_CElt *)local_238,local_224);
          }
          psVar17 = local_210;
          if (sVar5 - 1 < 0xffffffffffffff88) {
            pbVar15 = (byte *)((long)&local_210->offBase + sVar5);
            if ((!bVar25) && (pbVar21 <= pbVar15)) {
LAB_00591a25:
              pbVar9 = (byte *)ZSTD_noCompressLiterals(local_220,sVar23,source,(size_t)pbVar21);
              goto LAB_00591a38;
            }
            if (uVar16 < ((ulong)((byte *)0x3ff < pbVar15) - (ulong)(pbVar15 < (byte *)0x4000)) + 4)
            {
              if (pbVar15 <= pbVar21) {
                __assertion = "cLitSize > litSize";
                uVar18 = 0x5e;
                goto LAB_00592010;
              }
              goto LAB_00591a25;
            }
            iVar3 = (int)pbVar21 * 0x10;
            uVar19 = (uint)pbVar15;
            iVar11 = (int)local_240;
            if (uVar16 == 5) {
              *(uint *)(local_268 + 3) = uVar19 * 0x400000 + iVar11 + iVar3 + 0xc;
              local_268[7] = (byte)(uVar19 >> 10);
            }
            else if (uVar16 == 4) {
              *(uint *)local_220 = uVar19 * 0x40000 + iVar11 + iVar3 + 8;
            }
            else {
              iVar3 = uVar19 * 0x4000 + iVar11 + iVar3;
              *(short *)(local_268 + 3) = (short)iVar3;
              local_268[5] = (byte)((uint)iVar3 >> 0x10);
            }
            pbVar9 = pbVar9 + (sVar5 - (long)local_220);
            psVar17 = (seqDef *)0x0;
            goto LAB_00591a3e;
          }
        }
        else {
          if (entropyMetadata.hufMetadata.hType != set_rle) {
            if (entropyMetadata.hufMetadata.hType != set_basic) {
              __assertion = 
              "hufMetadata->hType == set_compressed || hufMetadata->hType == set_repeat";
              uVar18 = 0x45;
LAB_00592010:
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                            ,uVar18,
                            "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                           );
            }
            goto LAB_00591a25;
          }
          pbVar9 = (byte *)ZSTD_compressRleLiteralsBlock(local_220,sVar23,source,(size_t)pbVar21);
LAB_00591a38:
          psVar17 = (seqDef *)CONCAT71((int7)((ulong)pbVar15 >> 8),1);
LAB_00591a3e:
          if ((byte *)0xffffffffffffff88 < pbVar9) {
            return (size_t)pbVar9;
          }
          if (pbVar9 != (byte *)0x0) {
            pbVar9 = local_220 + (long)pbVar9;
            uVar19 = (local_198->appliedParams).cParams.windowLog;
            if (local_230 - (long)pbVar9 < 4) {
              return (size_t)(byte *)0xffffffffffffffba;
            }
            if (local_260 < 0x7f) {
              *pbVar9 = (byte)local_260;
              if (local_260 != 0) {
                local_210 = (seqDef *)(pbVar9 + 1);
                goto LAB_00591aea;
              }
              bVar1 = true;
              pbVar15 = (byte *)0x1;
LAB_00591c2b:
              pbVar10 = pbVar9 + (long)pbVar15 + -(long)local_268;
              iVar3 = (bVar26 & (byte)uVar18 | 0xffffffec) + (int)pbVar10 * 8;
              *(short *)local_268 = (short)iVar3;
              local_268[2] = (byte)((uint)iVar3 >> 0x10);
              if ((byte *)0xffffffffffffff88 < pbVar10) {
                return (size_t)pbVar10;
              }
              if (pbVar10 != (byte *)0x0) {
                dst = (void *)(ulong)uVar18;
                if (pbVar10 < pbVar21 + lVar20) {
                  local_218 = local_218 + (long)(pbVar21 + lVar20);
                  if (local_1d8 < local_218) {
                    __assert_fail("ip + decompressedSize <= iend",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                                  ,0x1f7,
                                  "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                                 );
                  }
                  source = source + (long)pbVar21;
                  local_1f8 = local_1f8 + local_260;
                  local_200 = local_200 + local_260;
                  local_208 = local_208 + local_260;
                  if ((char)psVar17 == '\0') {
                    bVar25 = false;
                  }
                  if (!bVar1) {
                    bVar2 = false;
                  }
                  local_260 = 0;
                  pbVar21 = (byte *)0x0;
                  local_248 = local_190;
                  local_268 = pbVar9 + (long)pbVar15;
                }
                goto LAB_00591ceb;
              }
            }
            else {
              if (local_260 < 0x7f00) {
                *pbVar9 = (byte)(local_260 >> 8) | 0x80;
                pbVar9[1] = (byte)local_260;
                local_210 = (seqDef *)(pbVar9 + 2);
              }
              else {
                *pbVar9 = 0xff;
                *(short *)(pbVar9 + 1) = (short)local_260 + -0x7f00;
                local_210 = (seqDef *)(pbVar9 + 3);
              }
LAB_00591aea:
              local_240 = CONCAT44(local_240._4_4_,(int)psVar17);
              pbVar15 = (byte *)((long)&local_210->offBase + 1);
              local_220 = pbVar9;
              if (bVar2) {
                *(char *)&local_210->offBase =
                     (char)(entropyMetadata.fseMetadata.ofType << 4) +
                     (char)(entropyMetadata.fseMetadata.llType << 6) +
                     (char)entropyMetadata.fseMetadata.mlType * '\x04';
                memcpy(pbVar15,entropyMetadata.fseMetadata.fseTablesBuffer,
                       entropyMetadata.fseMetadata.fseTablesSize);
                pbVar15 = pbVar15 + entropyMetadata.fseMetadata.fseTablesSize;
              }
              else {
                *(byte *)&local_210->offBase = 0xfc;
              }
              psVar17 = local_1b8;
              pbVar9 = (byte *)ZSTD_encodeSequences
                                         (pbVar15,local_230 - (long)pbVar15,&local_1c8->offBase,
                                          local_200,&local_1b8->offBase,local_208,local_1c0,
                                          local_1f8,local_248,local_260,(uint)(0x39 < uVar19),
                                          (int)local_1a0);
              if ((byte *)0xffffffffffffff88 < pbVar9) {
                return (size_t)pbVar9;
              }
              if (((bVar2) && (entropyMetadata.fseMetadata.lastCountSize != 0)) &&
                 (pbVar9 + entropyMetadata.fseMetadata.lastCountSize < (byte *)0x4)) {
                dst = (void *)(ulong)uVar18;
                if (pbVar9 + entropyMetadata.fseMetadata.lastCountSize != (byte *)0x3) {
                  __assert_fail("fseMetadata->lastCountSize + bitstreamSize == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                                ,0xe7,
                                "size_t ZSTD_compressSubBlock_sequences(const ZSTD_fseCTables_t *, const ZSTD_fseCTablesMetadata_t *, const seqDef *, size_t, const BYTE *, const BYTE *, const BYTE *, const ZSTD_CCtx_params *, void *, size_t, const int, int, int *)"
                               );
                }
                goto LAB_00591ceb;
              }
              if (3 < (long)(pbVar15 + (long)pbVar9) - (long)local_210) {
                pbVar15 = pbVar15 + (long)pbVar9 + -(long)local_220;
                if ((byte *)0xffffffffffffff88 < pbVar15) {
                  return (size_t)pbVar15;
                }
                if (pbVar15 != (byte *)0x0) {
                  bVar1 = false;
                  psVar17 = (seqDef *)(local_240 & 0xffffffff);
                  pbVar9 = local_220;
                  goto LAB_00591c2b;
                }
              }
            }
          }
        }
        dst = (void *)(ulong)uVar18;
      }
LAB_00591ceb:
    } while ((char)dst == '\0');
    if (bVar25) {
      memcpy(local_238,local_1e8,0x810);
    }
    pvVar24 = local_1e0;
    if ((bVar2) &&
       (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
         (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
        (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
      local_268 = (byte *)0x0;
    }
    else {
      if (local_218 < local_1d8) {
        __n = (long)local_1d8 - (long)local_218;
        pbVar21 = (byte *)(__n + 3);
        if ((byte *)(local_230 - (long)local_268) < pbVar21) {
          return (size_t)(byte *)0xffffffffffffffba;
        }
        iVar3 = (int)local_1d0 + (int)__n * 8;
        *(short *)local_268 = (short)iVar3;
        local_268[2] = (byte)((uint)iVar3 >> 0x10);
        memcpy(local_268 + 3,local_218,__n);
        if ((byte *)0xffffffffffffff88 < pbVar21) {
          return (size_t)pbVar21;
        }
        if (pbVar21 == (byte *)0x0) {
          __assert_fail("cSize != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x21a,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
        local_268 = local_268 + (long)pbVar21;
        if (local_248 < local_1a8) {
          uVar16 = *(ulong *)local_1e8->rep;
          UVar22 = local_1e8->rep[2];
          local_258._4_4_ = (U32)(uVar16 >> 0x20);
          UVar14 = local_258._4_4_;
          local_258 = uVar16;
          local_250 = UVar22;
          for (psVar17 = local_1b0; psVar17 < local_248; psVar17 = psVar17 + 1) {
            uVar18 = psVar17->offBase;
            ZVar4 = ZSTD_getSequenceLength(seqStorePtr,psVar17);
            UVar12 = (U32)uVar16;
            if (uVar18 < 4) {
              if (uVar18 == 0) {
                __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
              }
              uVar19 = (uVar18 + (ZVar4.litLength == 0)) - 1;
              if (uVar19 != 0) {
                if (uVar19 == 3) {
                  uVar18 = UVar12 - 1;
                }
                else {
                  uVar18 = *(uint *)((long)&local_258 + (ulong)uVar19 * 4);
                }
                if (uVar19 == 1) {
                  UVar14 = UVar22;
                }
                goto LAB_00591efa;
              }
            }
            else {
              uVar18 = uVar18 - 3;
LAB_00591efa:
              UVar22 = UVar14;
              local_258 = CONCAT44(UVar12,uVar18);
              uVar16 = (ulong)uVar18;
              UVar14 = UVar12;
              local_250 = UVar22;
            }
          }
          local_238->rep[2] = local_250;
          *(ulong *)local_238->rep = local_258;
          pvVar24 = local_1e0;
        }
      }
      local_268 = local_268 + -(long)pvVar24;
    }
  }
  return (size_t)local_268;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}